

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O1

int Amap_ManCountInverters(Amap_Man_t *p)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)p->vObjs->nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    iVar2 = 0;
    do {
      plVar1 = (long *)p->vObjs->pArray[lVar4];
      if (plVar1 != (long *)0x0) {
        iVar2 = iVar2 + (uint)(0 < *(int *)((long)plVar1 + (ulong)(-1 < *plVar1) * 4 + 0x2c));
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

int Amap_ManCountInverters( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    int i, Counter = 0;
    Amap_ManForEachObj( p, pObj, i )
        Counter += (int)(pObj->nFouts[!pObj->fPolar] > 0);
    return Counter;
}